

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O1

Pseudo * add_instruction_operand(Proc *proc,Instruction *insn,Pseudo *pseudo)

{
  Pseudo *pPVar1;
  
  if (((undefined1  [48])*pseudo & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
    pseudo = indexed_load(proc,pseudo);
    pPVar1 = pseudo;
  }
  else {
    pPVar1 = (Pseudo *)0x0;
  }
  raviX_ptrlist_add((PtrList **)&insn->operands,pseudo,proc->linearizer->compiler_state->allocator);
  return pPVar1;
}

Assistant:

static inline Pseudo *add_instruction_operand(Proc *proc, Instruction *insn, Pseudo *pseudo)
{
	Pseudo *to_free = NULL;
	if (pseudo->type == PSEUDO_INDEXED) {
		pseudo = indexed_load(proc, pseudo);
		to_free = pseudo;
	}
	raviX_ptrlist_add((PtrList **)&insn->operands, pseudo, proc->linearizer->compiler_state->allocator);
	return to_free;
}